

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,UChar *buff,int32_t buffLength,int32_t buffCapacity)

{
  long lVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e4bf0
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 0;
  if (buff == (UChar *)0x0) {
    (this->fUnion).fStackFields.fLengthAndFlags = 2;
  }
  else if (((buffCapacity < buffLength) || (buffLength < -1)) || (buffCapacity < 0)) {
    setToBogus(this);
  }
  else {
    if (buffLength == -1) {
      lVar1 = (ulong)(uint)buffCapacity * 2;
      for (pUVar2 = buff;
          (pUVar3 = buff + (uint)buffCapacity, lVar1 != 0 && (pUVar3 = pUVar2, *pUVar2 != L'\0'));
          pUVar2 = pUVar2 + 1) {
        lVar1 = lVar1 + -2;
      }
      buffLength = (int32_t)((ulong)((long)pUVar3 - (long)buff) >> 1);
    }
    setLength(this,buffLength);
    (this->fUnion).fFields.fArray = buff;
    (this->fUnion).fFields.fCapacity = buffCapacity;
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(UChar *buff,
                             int32_t buffLength,
                             int32_t buffCapacity) {
  fUnion.fFields.fLengthAndFlags = kWritableAlias;
  if(buff == NULL) {
    // treat as an empty string, do not alias
    setToEmpty();
  } else if(buffLength < -1 || buffCapacity < 0 || buffLength > buffCapacity) {
    setToBogus();
  } else {
    if(buffLength == -1) {
      // fLength = u_strlen(buff); but do not look beyond buffCapacity
      const UChar *p = buff, *limit = buff + buffCapacity;
      while(p != limit && *p != 0) {
        ++p;
      }
      buffLength = (int32_t)(p - buff);
    }
    setArray(buff, buffLength, buffCapacity);
  }
}